

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvPostProcess.cpp
# Opt level: O3

void __thiscall spv::Builder::postProcessType(Builder *this,Instruction *inst,Id typeId)

{
  Op OVar1;
  uint uVar2;
  Instruction *pIVar3;
  bool bVar4;
  Op OVar5;
  int iVar6;
  StorageClass SVar7;
  _Rb_tree_node_base *p_Var8;
  Id typeId_00;
  char *ext;
  Capability local_2c;
  
  OVar5 = getMostBasicTypeClass(this,typeId);
  iVar6 = 0;
  if (OVar5 - OpTypeInt < 2) {
    iVar6 = getScalarTypeWidth(this,typeId);
  }
  OVar1 = inst->opCode;
  if ((int)OVar1 < 0x43) {
    if (1 < OVar1 - OpLoad) {
      if (OVar1 == OpExtInst) {
        if ((*(inst->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 2) != 0) {
          __assert_fail("!idOperand[op]",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                        ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
        }
        uVar2 = (inst->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[1];
        if (uVar2 - 0x4c < 3) {
          if (0x102ff < this->spvVersion) {
            return;
          }
          bVar4 = containsType(this,typeId,OpTypeFloat,0x10);
          if (!bVar4) {
            return;
          }
          ext = "SPV_AMD_gpu_shader_half_float";
        }
        else {
          if (1 < uVar2 - 0x33) {
            return;
          }
          if (0x102ff < this->spvVersion) {
            return;
          }
          bVar4 = containsType(this,typeId,OpTypeInt,0x10);
          if (!bVar4) {
            return;
          }
          ext = "SPV_AMD_gpu_shader_int16";
        }
        addExtension(this,ext);
        return;
      }
      if (OVar1 != OpAccessChain) goto LAB_00468762;
LAB_0046878b:
      if (OVar5 != OpTypeInt) {
        return;
      }
      if ((this->module).idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[typeId]->opCode == OpTypePointer) {
        return;
      }
      if (iVar6 == 8) goto LAB_004688d8;
      goto LAB_00468895;
    }
    if (OVar5 == OpTypeStruct) {
      bVar4 = containsType(this,typeId,OpTypeInt,8);
      if (bVar4) {
        local_2c = CapabilityInt8;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&this->capabilities,&local_2c);
      }
      bVar4 = containsType(this,typeId,OpTypeInt,0x10);
      if (bVar4) {
        local_2c = CapabilityInt16;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&this->capabilities,&local_2c);
      }
      bVar4 = containsType(this,typeId,OpTypeFloat,0x10);
      if (!bVar4) {
        return;
      }
      goto LAB_00468744;
    }
    if ((*(inst->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1) == 0) {
      __assert_fail("idOperand[op]",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                    ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
    }
    pIVar3 = (this->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start
             [*(inst->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start];
    if (pIVar3 == (Instruction *)0x0) {
      typeId_00 = 0;
    }
    else {
      typeId_00 = pIVar3->typeId;
    }
    SVar7 = Module::getStorageClass(&this->module,typeId_00);
    if (iVar6 != 0x10) {
      if (iVar6 != 8) {
        return;
      }
      if ((SVar7 < (StorageBuffer|Input)) && ((0x1204U >> (SVar7 & 0x1f) & 1) != 0)) {
        return;
      }
      if (SVar7 == PhysicalStorageBuffer) {
        return;
      }
      goto LAB_004688d8;
    }
    if ((SVar7 < (StorageBuffer|Input)) && ((0x120eU >> (SVar7 & 0x1f) & 1) != 0)) {
      return;
    }
    if (SVar7 == PhysicalStorageBuffer) {
      return;
    }
    if (OVar5 != OpTypeInt) {
      if (OVar5 != OpTypeFloat) {
        return;
      }
      goto LAB_00468744;
    }
  }
  else {
    if (OVar1 - OpUConvert < 3) {
      bVar4 = containsType(this,typeId,OpTypeFloat,0x10);
      if ((bVar4) || (bVar4 = containsType(this,typeId,OpTypeInt,0x10), bVar4)) {
        for (p_Var8 = (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != &(this->capabilities)._M_t._M_impl.super__Rb_tree_header;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          if (0xfffffffb < p_Var8[1]._M_color - 0x1155) goto LAB_0046865a;
        }
        bVar4 = containsType(this,typeId,OpTypeFloat,0x10);
        if (bVar4) {
          local_2c = CapabilityFloat16;
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)&this->capabilities,&local_2c);
        }
        bVar4 = containsType(this,typeId,OpTypeInt,0x10);
        if (bVar4) {
          local_2c = CapabilityInt16;
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)&this->capabilities,&local_2c);
        }
      }
LAB_0046865a:
      bVar4 = containsType(this,typeId,OpTypeInt,8);
      if (!bVar4) {
        return;
      }
      for (p_Var8 = (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &(this->capabilities)._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        if (0xfffffffc < p_Var8[1]._M_color - 0x1163) {
          return;
        }
      }
      local_2c = CapabilityInt8;
      goto LAB_004688ea;
    }
    if (OVar1 == OpPtrAccessChain) goto LAB_0046878b;
    if (OVar1 == OpCopyObject) {
      return;
    }
LAB_00468762:
    if (OVar5 != OpTypeInt) {
      if (OVar5 != OpTypeFloat) {
        return;
      }
      if (iVar6 == 0x40) {
        local_2c = CapabilityFloat64;
        goto LAB_004688ea;
      }
      if (iVar6 != 0x10) {
        return;
      }
LAB_00468744:
      local_2c = CapabilityFloat16;
      goto LAB_004688ea;
    }
    if (iVar6 == 8) {
LAB_004688d8:
      local_2c = CapabilityInt8;
      goto LAB_004688ea;
    }
    if (iVar6 == 0x40) {
      local_2c = CapabilityInt64;
      goto LAB_004688ea;
    }
LAB_00468895:
    if (iVar6 != 0x10) {
      return;
    }
  }
  local_2c = CapabilityInt16;
LAB_004688ea:
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
              *)&this->capabilities,&local_2c);
  return;
}

Assistant:

void Builder::postProcessType(const Instruction& inst, Id typeId)
{
    // Characterize the type being questioned
    Id basicTypeOp = getMostBasicTypeClass(typeId);
    int width = 0;
    if (basicTypeOp == OpTypeFloat || basicTypeOp == OpTypeInt)
        width = getScalarTypeWidth(typeId);

    // Do opcode-specific checks
    switch (inst.getOpCode()) {
    case OpLoad:
    case OpStore:
        if (basicTypeOp == OpTypeStruct) {
            if (containsType(typeId, OpTypeInt, 8))
                addCapability(CapabilityInt8);
            if (containsType(typeId, OpTypeInt, 16))
                addCapability(CapabilityInt16);
            if (containsType(typeId, OpTypeFloat, 16))
                addCapability(CapabilityFloat16);
        } else {
            StorageClass storageClass = getStorageClass(inst.getIdOperand(0));
            if (width == 8) {
                switch (storageClass) {
                case StorageClassPhysicalStorageBufferEXT:
                case StorageClassUniform:
                case StorageClassStorageBuffer:
                case StorageClassPushConstant:
                    break;
                default:
                    addCapability(CapabilityInt8);
                    break;
                }
            } else if (width == 16) {
                switch (storageClass) {
                case StorageClassPhysicalStorageBufferEXT:
                case StorageClassUniform:
                case StorageClassStorageBuffer:
                case StorageClassPushConstant:
                case StorageClassInput:
                case StorageClassOutput:
                    break;
                default:
                    if (basicTypeOp == OpTypeInt)
                        addCapability(CapabilityInt16);
                    if (basicTypeOp == OpTypeFloat)
                        addCapability(CapabilityFloat16);
                    break;
                }
            }
        }
        break;
    case OpCopyObject:
        break;
    case OpFConvert:
    case OpSConvert:
    case OpUConvert:
        // Look for any 8/16-bit storage capabilities. If there are none, assume that
        // the convert instruction requires the Float16/Int8/16 capability.
        if (containsType(typeId, OpTypeFloat, 16) || containsType(typeId, OpTypeInt, 16)) {
            bool foundStorage = false;
            for (auto it = capabilities.begin(); it != capabilities.end(); ++it) {
                spv::Capability cap = *it;
                if (cap == spv::CapabilityStorageInputOutput16 ||
                    cap == spv::CapabilityStoragePushConstant16 ||
                    cap == spv::CapabilityStorageUniformBufferBlock16 ||
                    cap == spv::CapabilityStorageUniform16) {
                    foundStorage = true;
                    break;
                }
            }
            if (!foundStorage) {
                if (containsType(typeId, OpTypeFloat, 16))
                    addCapability(CapabilityFloat16);
                if (containsType(typeId, OpTypeInt, 16))
                    addCapability(CapabilityInt16);
            }
        }
        if (containsType(typeId, OpTypeInt, 8)) {
            bool foundStorage = false;
            for (auto it = capabilities.begin(); it != capabilities.end(); ++it) {
                spv::Capability cap = *it;
                if (cap == spv::CapabilityStoragePushConstant8 ||
                    cap == spv::CapabilityUniformAndStorageBuffer8BitAccess ||
                    cap == spv::CapabilityStorageBuffer8BitAccess) {
                    foundStorage = true;
                    break;
                }
            }
            if (!foundStorage) {
                addCapability(CapabilityInt8);
            }
        }
        break;
    case OpExtInst:
        switch (inst.getImmediateOperand(1)) {
        case GLSLstd450Frexp:
        case GLSLstd450FrexpStruct:
            if (getSpvVersion() < spv::Spv_1_3 && containsType(typeId, OpTypeInt, 16))
                addExtension(spv::E_SPV_AMD_gpu_shader_int16);
            break;
        case GLSLstd450InterpolateAtCentroid:
        case GLSLstd450InterpolateAtSample:
        case GLSLstd450InterpolateAtOffset:
            if (getSpvVersion() < spv::Spv_1_3 && containsType(typeId, OpTypeFloat, 16))
                addExtension(spv::E_SPV_AMD_gpu_shader_half_float);
            break;
        default:
            break;
        }
        break;
    case OpAccessChain:
    case OpPtrAccessChain:
        if (isPointerType(typeId))
            break;
        if (basicTypeOp == OpTypeInt) {
            if (width == 16)
                addCapability(CapabilityInt16);
            else if (width == 8)
                addCapability(CapabilityInt8);
        }
        break;
    default:
        if (basicTypeOp == OpTypeInt) {
            if (width == 16)
                addCapability(CapabilityInt16);
            else if (width == 8)
                addCapability(CapabilityInt8);
            else if (width == 64)
                addCapability(CapabilityInt64);
        } else if (basicTypeOp == OpTypeFloat) {
            if (width == 16)
                addCapability(CapabilityFloat16);
            else if (width == 64)
                addCapability(CapabilityFloat64);
        }
        break;
    }
}